

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::rmpath(QFileSystemEntry *entry)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  long in_FS_OFFSET;
  qsizetype slash;
  char sep;
  QByteArray path;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined8 in_stack_ffffffffffffff50;
  char cVar6;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff5c;
  bool local_93;
  QChar local_92 [57];
  QByteArray local_20;
  long local_8;
  
  cVar6 = (char)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QFileSystemEntry::filePath
            ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QDir::cleanPath((QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QFile::encodeName((QString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  QString::~QString((QString *)0x16df71);
  QString::~QString((QString *)0x16df7b);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x16df88);
  if (bVar1) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    local_93 = false;
  }
  else {
    bVar1 = qIsFilenameBroken((QByteArray *)0x16dfe5);
    if (bVar1) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      local_93 = false;
    }
    else {
      pcVar5 = QByteArray::constData((QByteArray *)0x16e046);
      iVar3 = ::rmdir(pcVar5);
      if (iVar3 == 0) {
        local_92[0] = QDir::separator();
        cVar2 = QChar::toLatin1(local_92);
        uVar7 = CONCAT13(cVar2,(int3)in_stack_ffffffffffffff58);
        pcVar5 = (char *)QByteArray::lastIndexOf
                                   ((QByteArray *)CONCAT44(in_stack_ffffffffffffff5c,uVar7),cVar6,
                                    CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        __length = extraout_RDX;
        while (0 < (long)pcVar5) {
          QByteArray::truncate(&local_20,pcVar5,__length);
          cVar6 = (char)((ulong)pcVar5 >> 0x38);
          pcVar5 = QByteArray::constData((QByteArray *)0x16e0c2);
          iVar3 = ::rmdir(pcVar5);
          if (iVar3 != 0) break;
          pcVar5 = (char *)QByteArray::lastIndexOf
                                     ((QByteArray *)CONCAT44(in_stack_ffffffffffffff5c,uVar7),cVar6,
                                      CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48))
          ;
          __length = extraout_RDX_00;
        }
        local_93 = true;
      }
      else {
        local_93 = false;
      }
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x16e10d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_93;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::rmpath(const QFileSystemEntry &entry)
{
    QByteArray path = QFile::encodeName(QDir::cleanPath(entry.filePath()));
    Q_CHECK_FILE_NAME(path, false);

    if (::rmdir(path.constData()) != 0)
        return false; // Only return false if `entry` couldn't be deleted

    const char sep = QDir::separator().toLatin1();
    qsizetype slash = path.lastIndexOf(sep);
    // `slash > 0` because truncate(0) would make `path` empty
    for (; slash > 0; slash = path.lastIndexOf(sep)) {
        path.truncate(slash);
        if (::rmdir(path.constData()) != 0)
            break;
    }

    return true;
}